

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>::Setup
          (TextbookBoyerMooreWithLinearMap<char16_t> *this,ArenaAllocator *allocator,
          TextbookBoyerMooreSetup<char16_t> *setup)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  int32 *piVar4;
  
  if (setup->scheme != LinearScheme) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0x117,"(setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme)",
                       "setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  CharMap<char16_t,_int,_(UnifiedRegex::CharMapScheme)0>::Set
            (&this->lastOccurrence,setup->numLinearChars,setup->linearChar,setup->lastOcc);
  piVar4 = TextbookBoyerMooreSetup<char16_t>::GetGoodSuffix(allocator,setup->pat,setup->patLen,1);
  this->goodSuffix = piVar4;
  return;
}

Assistant:

void TextbookBoyerMooreWithLinearMap<C>::Setup(ArenaAllocator * allocator, TextbookBoyerMooreSetup<C> const& setup)
    {
        Assert(setup.GetScheme() == TextbookBoyerMooreSetup<C>::LinearScheme);
        lastOccurrence.Set(setup.numLinearChars, setup.linearChar, setup.lastOcc);
        goodSuffix = TextbookBoyerMooreSetup<C>::GetGoodSuffix(allocator, setup.pat, setup.patLen);
    }